

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Cart_get(MPIABI_Comm comm,int maxdims,int *dims,int *periods,int *coords)

{
  int iVar1;
  
  iVar1 = MPI_Cart_get();
  return iVar1;
}

Assistant:

int MPIABI_Cart_get(
  MPIABI_Comm comm,
  int maxdims,
  int * dims,
  int * periods,
  int * coords
) {
  return MPI_Cart_get(
    (MPI_Comm)(WPI_Comm)comm,
    maxdims,
    dims,
    periods,
    coords
  );
}